

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

string * __thiscall
Debugger::GetFile_abi_cxx11_(string *__return_storage_ptr__,Debugger *this,lua_Debug *ar)

{
  lua_State *L;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  allocator *paVar4;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  L = this->currentL;
  if (L == (lua_State *)0x0) {
    pcVar2 = "";
    paVar4 = &local_21;
  }
  else {
    pcVar2 = getDebugSource(ar);
    iVar1 = getDebugCurrentLine(ar);
    if (iVar1 < 0) {
      paVar4 = &local_22;
    }
    else {
      pcVar2 = pcVar2 + (*pcVar2 == '@');
      (*lua_pushcclosure)(L,FixPath,0);
      (*lua_pushstring)(L,pcVar2);
      iVar1 = lua_pcall(L,1,1,0);
      if (iVar1 == 0) {
        pcVar3 = (*lua_tolstring)(L,-1,(size_t *)0x0);
        (*lua_settop)(L,-2);
        if (pcVar3 != (char *)0x0) {
          paVar4 = &local_23;
          pcVar2 = pcVar3;
          goto LAB_00155c00;
        }
      }
      paVar4 = &local_24;
    }
  }
LAB_00155c00:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string Debugger::GetFile(lua_Debug *ar) const {
	if (!currentL) {
		return "";
	}

	auto L = currentL;

	const char *file = getDebugSource(ar);
	if (getDebugCurrentLine(ar) < 0)
		return file;
	if (strlen(file) > 0 && file[0] == '@')
		file++;
	lua_pushcclosure(L, FixPath, 0);
	lua_pushstring(L, file);
	const int result = lua_pcall(L, 1, 1, 0);
	if (result == LUA_OK) {
		const auto p = lua_tostring(L, -1);
		lua_pop(L, 1);
		if (p) {
			return p;
		}
	}
	// todo: handle error
	return file;
}